

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::ljust(string *__return_storage_ptr__,string *str,int width)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((int)str->_M_string_length < width) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_38,(char)width - (char)str->_M_string_length);
    std::operator+(__return_storage_ptr__,str,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ljust( const std::string & str, int width )
    {
        std::string::size_type len = str.size();
        if ( (( int ) len ) >= width ) return str;
        return str + std::string( width - len, ' ' );
    }